

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

size_t __thiscall
anon_unknown.dwarf_4381551::root_dir_start
          (anon_unknown_dwarf_4381551 *this,StringRef str,Style style)

{
  anon_unknown_dwarf_4381551 aVar1;
  size_type sVar2;
  int iVar3;
  char *pcVar4;
  StringRef Chars;
  undefined1 local_18 [8];
  StringRef str_local;
  
  str_local.Data = str.Data;
  iVar3 = (int)str.Length;
  if (iVar3 == 0) {
    if ((char *)0x2 < str_local.Data) {
      if (this[1] == (anon_unknown_dwarf_4381551)0x3a) {
        if (this[2] == (anon_unknown_dwarf_4381551)0x2f) {
          return 2;
        }
        if (this[2] == (anon_unknown_dwarf_4381551)0x5c) {
          return 2;
        }
      }
      goto LAB_00d99ce3;
    }
LAB_00d99d77:
    if (str_local.Data == (char *)0x0) {
      return 0xffffffffffffffff;
    }
    aVar1 = *this;
  }
  else {
LAB_00d99ce3:
    if (str_local.Data < (char *)0x4) goto LAB_00d99d77;
    aVar1 = *this;
    if ((aVar1 != (anon_unknown_dwarf_4381551)0x2f) &&
       (iVar3 != 0 || aVar1 != (anon_unknown_dwarf_4381551)0x5c)) goto LAB_00d99d82;
    if (aVar1 == this[1]) {
      if ((this[2] != (anon_unknown_dwarf_4381551)0x2f) &&
         (iVar3 != 0 || this[2] != (anon_unknown_dwarf_4381551)0x5c)) {
        pcVar4 = "/";
        if (iVar3 == 0) {
          pcVar4 = "\\/";
        }
        Chars.Length = (ulong)(iVar3 == 0) + 1;
        Chars.Data = pcVar4;
        local_18 = (undefined1  [8])this;
        sVar2 = llvm::StringRef::find_first_of((StringRef *)local_18,Chars,2);
        return sVar2;
      }
    }
  }
  if (aVar1 == (anon_unknown_dwarf_4381551)0x2f) {
    return 0;
  }
LAB_00d99d82:
  if (iVar3 == 0 && aVar1 == (anon_unknown_dwarf_4381551)0x5c) {
    return 0;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t root_dir_start(StringRef str, Style style) {
    // case "c:/"
    if (real_style(style) == Style::windows) {
      if (str.size() > 2 && str[1] == ':' && is_separator(str[2], style))
        return 2;
    }

    // case "//net"
    if (str.size() > 3 && is_separator(str[0], style) && str[0] == str[1] &&
        !is_separator(str[2], style)) {
      return str.find_first_of(separators(style), 2);
    }

    // case "/"
    if (str.size() > 0 && is_separator(str[0], style))
      return 0;

    return StringRef::npos;
  }